

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O1

QStringList * QDir::searchPaths(QStringList *__return_storage_ptr__,QString *prefix)

{
  Type *this;
  
  if ((__atomic_base<signed_char>)
      QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dirSearchPaths>::guard._q_value.
      super___atomic_base<signed_char>._M_i == -1) {
    this = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dirSearchPaths>_>::
           operator*((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dirSearchPaths>_>
                      *)__return_storage_ptr__);
    QReadWriteLock::lockForRead(&this->mutex);
    QHash<QString,_QList<QString>_>::value(__return_storage_ptr__,&this->paths,prefix);
    QReadWriteLock::unlock(&this->mutex);
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QString *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

QStringList QDir::searchPaths(const QString &prefix)
{
    if (!dirSearchPaths.exists())
        return QStringList();

    const DirSearchPaths &conf = *dirSearchPaths;
    const QReadLocker lock(&conf.mutex);
    return conf.paths.value(prefix);
}